

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

void Hex::Hexdumper<unsigned_short>::output_bin(ostream *os,remove_const_t<unsigned_short> val)

{
  undefined8 uVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  int len;
  long lVar5;
  undefined8 uStack_130;
  char bits [257];
  
  lVar5 = 0;
  for (uVar4 = (ulong)val; (short)uVar4 != 0; uVar4 = uVar4 >> 1) {
    bits[lVar5] = (byte)uVar4 & 1 | 0x30;
    lVar5 = lVar5 + 1;
  }
  bits[lVar5] = '\0';
  uVar1 = *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10);
  uStack_130 = 0x109499;
  cVar2 = std::ios::fill();
  if ((int)lVar5 < (int)uVar1) {
    cVar3 = ' ';
    if (cVar2 != '\0') {
      cVar3 = cVar2;
    }
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)uVar1 - (int)lVar5);
    while( true ) {
      uStack_130 = 0x1094e3;
      std::operator<<(os,cVar3);
LAB_001094cd:
      if (lVar5 < 1) break;
      cVar3 = bits[lVar5 + -1];
      lVar5 = lVar5 + -1;
    }
    return;
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0;
  goto LAB_001094cd;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }